

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpunsafe.c
# Opt level: O2

mp_int * mp_unsafe_shrink(mp_int *x)

{
  size_t sVar1;
  
  sVar1 = mp_unsafe_words_needed(x);
  x->nw = sVar1;
  return x;
}

Assistant:

mp_int *mp_unsafe_shrink(mp_int *x)
{
    x->nw = mp_unsafe_words_needed(x);
    /* This potentially leaves some allocated words between the new
     * and old values of x->nw, which won't be wiped by mp_free now
     * that x->nw doesn't mention that they exist. But we've just
     * checked they're all zero, so we don't need to wipe them now
     * either. */
    return x;
}